

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O3

mraa_result_t i2c_get(int bus,uint8_t device_address,uint8_t register_address,uint8_t *data)

{
  mraa_result_t mVar1;
  int iVar2;
  long lVar3;
  undefined4 in_register_0000003c;
  
  lVar3 = mraa_i2c_init(CONCAT44(in_register_0000003c,bus));
  if (lVar3 == 0) {
    mVar1 = MRAA_ERROR_NO_RESOURCES;
  }
  else {
    mVar1 = mraa_i2c_address(lVar3,device_address);
    if ((mVar1 == MRAA_SUCCESS) &&
       (mVar1 = mraa_i2c_write_byte(lVar3,register_address), mVar1 == MRAA_SUCCESS)) {
      iVar2 = mraa_i2c_read(lVar3,data,1);
      mVar1 = MRAA_ERROR_UNSPECIFIED;
      if (iVar2 == 1) {
        mVar1 = MRAA_SUCCESS;
      }
    }
    mraa_i2c_stop(lVar3);
  }
  return mVar1;
}

Assistant:

mraa_result_t
i2c_get(int bus, uint8_t device_address, uint8_t register_address, uint8_t* data)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_i2c_context i2c = mraa_i2c_init(bus);
    if (i2c == NULL) {
        return MRAA_ERROR_NO_RESOURCES;
    }
    status = mraa_i2c_address(i2c, device_address);
    if (status != MRAA_SUCCESS) {
        goto i2c_get_exit;
    }
    status = mraa_i2c_write_byte(i2c, register_address);
    if (status != MRAA_SUCCESS) {
        goto i2c_get_exit;
    }
    status = mraa_i2c_read(i2c, data, 1) == 1 ? MRAA_SUCCESS : MRAA_ERROR_UNSPECIFIED;
    if (status != MRAA_SUCCESS) {
        goto i2c_get_exit;
    }
i2c_get_exit:
    mraa_i2c_stop(i2c);
    return status;
}